

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  ParamDictPrivate *pPVar1;
  char *pcVar2;
  bool bVar3;
  char *__s;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParamDict *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar7;
  ulong uVar8;
  ParamDict *pPVar9;
  int id;
  int len;
  vector<char,_std::allocator<char>_> tmpstr;
  undefined1 local_5c [8];
  int local_54;
  vector<char,_std::allocator<char>_> local_50;
  DataReader *local_38;
  undefined4 extraout_var_01;
  
  clear(this);
  local_5c._0_4_ = 0;
  iVar5 = (*dr->_vptr_DataReader[3])(dr,local_5c,4);
  local_38 = dr;
  if ((ParamDict *)CONCAT44(extraout_var,iVar5) == (ParamDict *)&DAT_00000004) {
    do {
      uVar8 = (ulong)(int)local_5c._0_4_;
      if (uVar8 == 0xffffffffffffff17) {
        return 0;
      }
      if ((int)local_5c._0_4_ < -0x5b67) {
        uVar6 = -local_5c._0_4_ - 0x5b68;
        uVar8 = (ulong)uVar6;
        bVar3 = (uint)local_5c._0_4_ < 0xffffa479;
        local_5c._0_4_ = uVar6;
        if (bVar3) goto LAB_0013fac4;
        local_54 = 0;
        iVar5 = (*dr->_vptr_DataReader[3])(dr,&local_54,4);
        if (CONCAT44(extraout_var_00,iVar5) != 4) {
          fprintf(_stderr,"ParamDict read array length failed %zd",CONCAT44(extraout_var_00,iVar5));
          goto LAB_0013fb21;
        }
        if (0xff < local_54) {
          load_param_bin((ParamDict *)local_5c);
          goto LAB_0013fb21;
        }
        iVar5 = local_54 + 6;
        if (-1 < local_54 + 3) {
          iVar5 = local_54 + 3;
        }
        pPVar9 = (ParamDict *)((long)(iVar5 >> 2) * 4);
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_50,(long)(iVar5 >> 2) * 4 + 1,(allocator_type *)(local_5c + 7));
        iVar5 = (*dr->_vptr_DataReader[3])
                          (dr,CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_50.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start),pPVar9);
        this_00 = (ParamDict *)CONCAT44(extraout_var_01,iVar5);
        if (this_00 == pPVar9) {
          *(undefined1 *)
           ((long)&pPVar9->_vptr_ParamDict +
           CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    (int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start)) = 0;
          __s = (char *)CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (int)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          pPVar1 = this->d;
          lVar7 = (long)(int)local_5c._0_4_;
          pcVar2 = (char *)pPVar1->params[(int)local_5c._0_4_].s._M_string_length;
          strlen(__s);
          dr = local_38;
          std::__cxx11::string::_M_replace((ulong)&pPVar1->params[lVar7].s,0,pcVar2,(ulong)__s);
          this->d->params[(int)local_5c._0_4_].type = 7;
        }
        else {
          load_param_bin(this_00);
        }
        pvVar4 = (void *)CONCAT44(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar4);
        }
        if (this_00 != pPVar9) {
          return -1;
        }
      }
      else if ((int)local_5c._0_4_ < -0x5b03) {
        uVar6 = -local_5c._0_4_ - 0x5b04;
        uVar8 = (ulong)uVar6;
        bVar3 = (int)local_5c._0_4_ < -0x5b23;
        local_5c._0_4_ = uVar6;
        if (bVar3) {
LAB_0013fac4:
          fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",uVar8,
                  0x20);
LAB_0013fb21:
          fputc(10,_stderr);
          return -1;
        }
        local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        iVar5 = (*dr->_vptr_DataReader[3])(dr,&local_50,4);
        if ((ParamDict *)CONCAT44(extraout_var_02,iVar5) != (ParamDict *)&DAT_00000004) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_02,iVar5));
          return -1;
        }
        Mat::create(&this->d->params[(int)local_5c._0_4_].v,
                    (int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,4,(Allocator *)0x0);
        iVar5 = (*dr->_vptr_DataReader[3])
                          (dr,this->d->params[(int)local_5c._0_4_].v.data,
                           (long)(int)local_50.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start << 2);
        if ((ParamDict *)CONCAT44(extraout_var_03,iVar5) !=
            (ParamDict *)
            ((long)(int)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start * 4)) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_03,iVar5));
          return -1;
        }
        this->d->params[(int)local_5c._0_4_].type = 4;
      }
      else {
        if (0x1f < (int)local_5c._0_4_) goto LAB_0013fac4;
        iVar5 = (*dr->_vptr_DataReader[3])(dr,&this->d->params[uVar8].field_1,4);
        if ((ParamDict *)CONCAT44(extraout_var_04,iVar5) != (ParamDict *)&DAT_00000004) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_04,iVar5));
          return -1;
        }
        this->d->params[(int)local_5c._0_4_].type = 1;
      }
      iVar5 = (*dr->_vptr_DataReader[3])(dr,local_5c,4);
    } while ((ParamDict *)CONCAT44(extraout_var_05,iVar5) == (ParamDict *)&DAT_00000004);
    load_param_bin((ParamDict *)CONCAT44(extraout_var_05,iVar5));
  }
  else {
    load_param_bin((ParamDict *)CONCAT44(extraout_var,iVar5));
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

#if __BIG_ENDIAN__
    swap_endianness_32(&id);
#endif

    while (id != -233)
    {
        bool is_array = id <= -23300;
        bool is_string = id <= -23400;
        if (is_string)
        {
            id = -id - 23400;
        }
        else if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_string)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            if (len > 255)
            {
                NCNN_LOGE("string too long (id=%d)", id);
                return -1;
            }

            size_t len_padded = (len + 3) / 4 * 4;
            std::vector<char> tmpstr(len_padded + 1);

            char* ptr = (char*)tmpstr.data();
            nread = dr.read(ptr, len_padded);
            if (nread != len_padded)
            {
                NCNN_LOGE("ParamDict read string failed %zd", nread);
                return -1;
            }

            tmpstr[len_padded] = '\0';

            d->params[id].s = tmpstr.data();

            d->params[id].type = 7;
        }
        else if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            for (int i = 0; i < len; i++)
            {
                swap_endianness_32(ptr + i);
            }
#endif

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&d->params[id].f);
#endif

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }

#if __BIG_ENDIAN__
        swap_endianness_32(&id);
#endif
    }

    return 0;
}